

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpn_lex.cpp
# Opt level: O3

string * __thiscall util::Lexer::ReadValue_abi_cxx11_(string *__return_storage_ptr__,Lexer *this)

{
  bool bVar1;
  char c;
  char local_59;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  code *local_50 [2];
  code *local_40;
  code *local_38;
  
  local_59 = '\0';
  local_58 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_58;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::istream::get((char *)this->is);
  std::__cxx11::string::push_back((char)__return_storage_ptr__);
  while( true ) {
    local_50[1] = (code *)0x0;
    local_50[0] = ctype_value;
    local_38 = std::_Function_handler<bool_(char),_bool_(*)(char)>::_M_invoke;
    local_40 = std::_Function_handler<bool_(char),_bool_(*)(char)>::_M_manager;
    bVar1 = GetCharIf(this,&local_59,(function<bool_(char)> *)local_50);
    if (local_40 != (code *)0x0) {
      (*local_40)((_Any_data *)local_50,(_Any_data *)local_50,__destroy_functor);
    }
    if (!bVar1) break;
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Lexer::ReadValue()
	{
		char c = '\0';
		std::string s;

		this->GetChar(c);
		s += c;

		while (this->GetCharIf(c, ctype_value))
		{
			s += c;
		}

		return s;
	}